

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t anon_unknown.dwarf_5db41::thread_safe_random(index_t choices_in)

{
  index_t iVar1;
  long *plVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if ((int)choices_in < 0xae529) {
    puVar3 = (ulong *)__tls_get_addr(&PTR_001aed50);
    uVar5 = (long)(*puVar3 * 0x556 + 0x24d69) % 0xae529;
    *puVar3 = uVar5;
    iVar1 = (index_t)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                     (long)(int)choices_in);
  }
  else {
    plVar2 = (long *)__tls_get_addr(&PTR_001aed50);
    lVar4 = (*plVar2 * 0x556 + 0x24d69) % 0xae529;
    lVar6 = (long)(((int)lVar4 * 0x556 + 0x24d69) % 0xae529);
    *plVar2 = lVar6;
    lVar6 = ((ulong)choices_in / 0xae529) * lVar4 + lVar6;
    if (lVar6 < (long)(ulong)choices_in) {
      choices_in = 0;
    }
    iVar1 = (int)lVar6 - choices_in;
  }
  return iVar1;
}

Assistant:

index_t thread_safe_random(index_t choices_in) {
        signed_index_t choices = signed_index_t(choices_in);
        static thread_local long int randomseed = 1l ;
        if (choices >= 714025l) {
            long int newrandom = (randomseed * 1366l + 150889l) % 714025l;
            randomseed = (newrandom * 1366l + 150889l) % 714025l;
            newrandom = newrandom * (choices / 714025l) + randomseed;
            if (newrandom >= choices) {
                return index_t(newrandom - choices);
            } else {
                return index_t(newrandom);
            }
        } else {
            randomseed = (randomseed * 1366l + 150889l) % 714025l;
            return index_t(randomseed % choices);
        }
    }